

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O2

void __thiscall
MultiQuery<dto::Simple,_dto::Simple>::on_input(MultiQuery<dto::Simple,_dto::Simple> *this,Poll *p)

{
  ushort uVar1;
  ssize_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  Error *this_00;
  socklen_t remln;
  Simple dto;
  string data;
  socklen_t local_bc;
  undefined1 local_b8 [24];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_78;
  undefined1 local_58 [56];
  
  local_bc = 0x10;
  sVar2 = recvfrom((this->super_Subscriber).fd,buffer_abi_cxx11_._M_dataplus._M_p,
                   buffer_abi_cxx11_._M_string_length,0,(sockaddr *)&this->remote,&local_bc);
  if (-1 < (int)sVar2) {
    std::__cxx11::string::substr((ulong)&local_78,0x159550);
    local_a0._M_p = (pointer)&local_90;
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8._10_6_ = 0;
    local_b8._16_2_ = 0;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    ::dto::unmarshall_facade<dto::Simple>((Simple *)local_58,&local_78);
    ::dto::Simple::operator=((Simple *)local_b8,(Simple *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 0x18));
    poVar3 = std::operator<<((ostream *)&std::cout,"MultiQuery: received ");
    poVar3 = operator<<(poVar3,(Simple *)local_b8);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (CONCAT26(local_b8._16_2_,local_b8._10_6_) == (this->req).header.cmd_seq) {
      if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(dto::Simple_&,_sockaddr_in)>::operator()
                  (&this->callback,(Simple *)local_b8,this->remote);
      }
    }
    else {
      pcVar4 = inet_ntoa((in_addr)(this->remote).sin_addr.s_addr);
      uVar1 = (this->remote).sin_port;
      poVar3 = std::operator<<((ostream *)&std::cout,"[PCKG ERROR] Skipping invalid package from ");
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 << 8 | uVar1 >> 8);
      poVar3 = std::operator<<(poVar3,". ");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_78);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Invalid read udp packet");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void MultiQuery<REQ, RES>::on_input(Poll &p) {
  socklen_t remln = sizeof(remote);
  int read = recvfrom(fd, &buffer[0], buffer.size(), 0, (struct sockaddr *) &remote, &remln);
  if (read < 0) {
    throw Error("Invalid read udp packet");
  }
  std::string data = buffer.substr(0, read);
  RES dto;
  try {
    dto = dto::unmarshall_facade<RES>(data);
  } catch (Error &e) {
    if (this->error)
      this->error();
    return;
  }
  std::cout << "MultiQuery: received " << dto << std::endl;
  if (dto.header.cmd_seq != this->req.header.cmd_seq) {
    char *s = inet_ntoa(remote.sin_addr);
    uint16_t port = ntohs(remote.sin_port);
    std::cout << "[PCKG ERROR] Skipping invalid package from " << s << ":" << port << ". " << std::endl;
  } else {
    if (this->callback)
      this->callback(dto, remote);
  }
}